

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O2

void __thiscall StringTest::Test8(StringTest *this)

{
  int iVar1;
  allocator<char> local_51;
  string t1;
  string t2;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t1,"Hello World, I\'d like to look for a string",(allocator<char> *)&t2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&t2,"or",&local_51);
  iVar1 = std::__cxx11::string::find((string *)&t1,(ulong)&t2);
  if (iVar1 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1e3,"Failed to find first string( \"or\" )");
  }
  iVar1 = std::__cxx11::string::find((string *)&t1,(ulong)&t2);
  if (iVar1 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1ea,"Failed to refind first string( \"or\" )");
  }
  iVar1 = std::__cxx11::string::find((string *)&t1,(ulong)&t2);
  if (iVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1f1,"Failed to find second string( \"or\" )");
  }
  iVar1 = std::__cxx11::string::find((char *)&t1,0x108bdd);
  if (iVar1 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1f6,"Failed to find first \"or\"");
  }
  iVar1 = std::__cxx11::string::find((char *)&t1,0x108bdd);
  if (iVar1 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x1fb,"Failed to refind first \"or\"");
  }
  iVar1 = std::__cxx11::string::find((char *)&t1,0x108bdd);
  if (iVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x200,"Failed to find second \"or\"");
  }
  iVar1 = std::__cxx11::string::find((char)&t1,0x57);
  if (iVar1 != 6) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x205,"Failed to find \'W\'");
  }
  iVar1 = std::__cxx11::string::find((char)&t1,0x6f);
  if (iVar1 != 4) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x20a,"Failed to find first \'o\'");
  }
  iVar1 = std::__cxx11::string::find((char)&t1,0x6f);
  if (iVar1 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x20f,"Failed to find second \'o\'");
  }
  iVar1 = std::__cxx11::string::find((char *)&t1,0x10879a,0);
  if (iVar1 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x214,"Failed to find first \"or\" (full)");
  }
  iVar1 = std::__cxx11::string::find((char *)&t1,0x10879a,8);
  if (iVar1 != 0x1f) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x219,"Failed to find second \"or\" (full)");
  }
  iVar1 = std::__cxx11::string::find((char *)&t1,0x10879a,7);
  if (iVar1 != 7) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x21e,"Failed to refind first \"or\" (full)");
  }
  TestCase::TestPassed(&this->super_TestCase);
  std::__cxx11::string::~string((string *)&t2);
  std::__cxx11::string::~string((string *)&t1);
  return;
}

Assistant:

void Test8()
	{
		string t1 = "Hello World, I'd like to look for a string";
		string t2 = "or";
		
		unsigned i = t1.find( t2 );
		
		if ( i != 7 )
			TestFailed( "Failed to find first string( \"or\" )" );
		
		i = t1.find( t2, i );

		LOG_NOTICE( "i = %d", i );
		
		if ( i != 7 )
			TestFailed( "Failed to refind first string( \"or\" )" );

		i = t1.find( t2, i + 1 );

		LOG_NOTICE( "i = %d", i );
		
		if ( i != 31 )
			TestFailed( "Failed to find second string( \"or\" )" );
		
		i = t1.find( "or" );

		if ( i != 7 )
			TestFailed( "Failed to find first \"or\"" );

		i = t1.find( "or", i );

		if ( i != 7 )
			TestFailed( "Failed to refind first \"or\"" );

		i = t1.find( "or", i + 1 );

		if ( i != 31 )
			TestFailed( "Failed to find second \"or\"" );

		i = t1.find( 'W' );

		if ( i != 6 )
			TestFailed( "Failed to find \'W\'" );

		i = t1.find( 'o', 4 );

		if ( i != 4 )
			TestFailed( "Failed to find first \'o\'" );
		
		i = t1.find( 'o', 5 );

		if ( i != 7 )
			TestFailed( "Failed to find second \'o\'" );
		
		i = t1.find( "orlando", 0, 2 );

		if ( i != 7 )
			TestFailed( "Failed to find first \"or\" (full)" );

		i = t1.find( "orlando", 8, 2 );

		if ( i != 31 )
			TestFailed( "Failed to find second \"or\" (full)" );

		i = t1.find( "orlando", 7, 2 );

		if ( i != 7 )
			TestFailed( "Failed to refind first \"or\" (full)" );
		
		// find
		TestPassed();
	}